

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_hooks_safety_check_abort_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  
  if (oldp == (void *)0x0 && oldlenp == (size_t *)0x0) {
    iVar1 = 0;
    if (newp != (void *)0x0) {
      if (newlen == 8) {
        duckdb_je_safety_check_set_abort(*newp);
        iVar1 = 0;
      }
      else {
        iVar1 = 0x16;
      }
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
experimental_hooks_safety_check_abort_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	WRITEONLY();
	if (newp != NULL) {
		if (newlen != sizeof(safety_check_abort_hook_t)) {
			ret = EINVAL;
			goto label_return;
		}
		safety_check_abort_hook_t hook JEMALLOC_CC_SILENCE_INIT(NULL);
		WRITE(hook, safety_check_abort_hook_t);
		safety_check_set_abort(hook);
	}
	ret = 0;
label_return:
	return ret;
}